

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O1

void __thiscall OPLio::OPLwriteFreq(OPLio *this,uint channel,uint note,uint pitch,uint keyon)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar3 = note * 0x20 + pitch;
  if ((int)uVar3 < 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    if (0x11b < (int)uVar3) {
      uVar2 = (uVar3 - 0x11c) / 0x180;
      uVar4 = 7;
      if (uVar2 < 7) {
        uVar4 = uVar2;
      }
      uVar3 = (uVar3 - 0x11c) % 0x180 + 0x11c;
      uVar4 = uVar4 << 10;
    }
  }
  uVar1 = frequencies[uVar3];
  (*this->_vptr_OPLio[4])(this,(ulong)channel / 9,(ulong)(channel % 9 | 0xa0),(ulong)(uVar1 & 0xff))
  ;
  (*this->_vptr_OPLio[4])
            (this,(ulong)(channel / 9),(ulong)(channel % 9 + 0xb0),
             (ulong)((keyon << 5 | (uVar4 | uVar1) >> 8) & 0xff));
  return;
}

Assistant:

void OPLio::OPLwriteFreq(uint channel, uint note, uint pitch, uint keyon)
{
	int octave = 0;
	int j = (note << 5) + pitch;

	if (j < 0)
	{
		j = 0;
	}
	else if (j >= 284)
	{
		j -= 284;
		octave = j / (32*12);
		if (octave > 7)
		{
			octave = 7;
		}
		j = (j % (32*12)) + 284;
	}
	int i = frequencies[j] | (octave << 10);

	OPLwriteValue (0xA0, channel, (BYTE)i);
	OPLwriteValue (0xB0, channel, (BYTE)(i>>8)|(keyon<<5));
}